

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter.c
# Opt level: O3

void filter8(int8_t mask,uint8_t thresh,int8_t flat,uint8_t *op3,uint8_t *op2,uint8_t *op1,
            uint8_t *op0,uint8_t *oq0,uint8_t *oq1,uint8_t *oq2,uint8_t *oq3)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  char cVar8;
  byte bVar9;
  byte bVar10;
  char cVar11;
  int iVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  
  uVar19 = (uint)*oq0;
  if (mask == '\0' || flat == '\0') {
    cVar15 = *op1 + 0x80;
    cVar14 = *oq1 + 0x80;
    cVar11 = cVar15 - cVar14;
    if (SBORROW1(cVar15,cVar14)) {
      cVar11 = (-1 < (char)(cVar15 - cVar14)) + '\x7f';
    }
    uVar7 = (int)(char)*op0 ^ 0xffffff80;
    uVar18 = (uint)*op1 - (uint)*op0;
    uVar17 = -uVar18;
    if (0 < (int)uVar18) {
      uVar17 = uVar18;
    }
    uVar18 = (uint)thresh;
    bVar4 = (uVar17 & 0xff) <= uVar18;
    uVar19 = *oq1 - uVar19;
    uVar17 = -uVar19;
    if (0 < (int)uVar19) {
      uVar17 = uVar19;
    }
    cVar8 = *oq0 + 0x80;
    uVar19 = (int)cVar11;
    if (bVar4 && uVar17 <= uVar18) {
      uVar19 = 0;
    }
    iVar12 = ((int)cVar8 - uVar7) * 3 + uVar19;
    iVar16 = 0x7f;
    if (iVar12 < 0x7f) {
      iVar16 = iVar12;
    }
    bVar9 = 0x80;
    if (-0x80 < iVar16) {
      bVar9 = (byte)iVar16;
    }
    bVar9 = bVar9 & mask;
    bVar10 = 0x7b;
    if ((char)bVar9 < '{') {
      bVar10 = bVar9;
    }
    cVar11 = (char)(bVar10 + 4) >> 3;
    uVar19 = (uint)(byte)((char)(cVar11 + '\x01') >> 1);
    if (!bVar4 || uVar17 > uVar18) {
      uVar19 = 0;
    }
    cVar6 = (char)uVar19;
    cVar13 = ((char)(cVar6 + cVar15) >> 7) + -0x80;
    if (!SCARRY1(cVar15,cVar6)) {
      cVar13 = cVar15 + cVar6;
    }
    cVar15 = cVar14 - cVar6;
    if (SBORROW1(cVar14,cVar6)) {
      cVar15 = (-1 < (char)(cVar14 - cVar6)) + '\x7f';
    }
    bVar10 = 0x7c;
    if ((char)bVar9 < '|') {
      bVar10 = bVar9;
    }
    cVar5 = (char)(bVar10 + 3) >> 3;
    cVar14 = (char)uVar7;
    cVar6 = ((char)(cVar14 + cVar5) >> 7) + -0x80;
    if (!SCARRY1(cVar5,cVar14)) {
      cVar6 = cVar5 + cVar14;
    }
    cVar14 = cVar8 - cVar11;
    if (SBORROW1(cVar8,cVar11)) {
      cVar14 = (-1 < (char)(cVar8 - cVar11)) + '\x7f';
    }
    *oq0 = cVar14 + 0x80;
    *op0 = cVar6 + 0x80;
    *oq1 = cVar15 + 0x80;
    *op1 = cVar13 + 0x80;
  }
  else {
    bVar9 = *op3;
    uVar17 = (uint)*op2;
    bVar10 = *op1;
    uVar7 = (uint)*op0;
    bVar1 = *oq1;
    bVar2 = *oq2;
    bVar3 = *oq3;
    *op2 = (uint8_t)((uint)bVar9 + (uint)bVar9 * 2 + (uint)*op0 + 4 + uVar17 * 2 + (uint)bVar10 +
                     uVar19 >> 3);
    iVar16 = uVar7 + uVar17 + 4;
    *op1 = (uint8_t)(iVar16 + ((uint)bVar10 + (uint)bVar9) * 2 + uVar19 + (uint)bVar1 >> 3);
    *op0 = (uint8_t)(bVar9 + uVar17 + (uint)bVar10 + uVar19 + uVar7 * 2 + (uint)bVar1 + (uint)bVar2
                     + 4 >> 3);
    *oq0 = (uint8_t)((uint)bVar1 + (uint)bVar2 + (uint)bVar3 + iVar16 + (uint)bVar10 + uVar19 * 2 >>
                    3);
    iVar16 = uVar7 + uVar19 + 4;
    *oq1 = (uint8_t)((uint)bVar10 + iVar16 + (uint)bVar1 * 2 + (uint)bVar2 + (uint)bVar3 * 2 >> 3);
    *oq2 = (uint8_t)(iVar16 + (uint)bVar1 + (uint)bVar2 * 2 + (uint)bVar3 + (uint)bVar3 * 2 >> 3);
  }
  return;
}

Assistant:

static inline void filter8(int8_t mask, uint8_t thresh, int8_t flat,
                           uint8_t *op3, uint8_t *op2, uint8_t *op1,
                           uint8_t *op0, uint8_t *oq0, uint8_t *oq1,
                           uint8_t *oq2, uint8_t *oq3) {
  if (flat && mask) {
    const uint8_t p3 = *op3, p2 = *op2, p1 = *op1, p0 = *op0;
    const uint8_t q0 = *oq0, q1 = *oq1, q2 = *oq2, q3 = *oq3;

    // 7-tap filter [1, 1, 1, 2, 1, 1, 1]
    *op2 = ROUND_POWER_OF_TWO(p3 + p3 + p3 + 2 * p2 + p1 + p0 + q0, 3);
    *op1 = ROUND_POWER_OF_TWO(p3 + p3 + p2 + 2 * p1 + p0 + q0 + q1, 3);
    *op0 = ROUND_POWER_OF_TWO(p3 + p2 + p1 + 2 * p0 + q0 + q1 + q2, 3);
    *oq0 = ROUND_POWER_OF_TWO(p2 + p1 + p0 + 2 * q0 + q1 + q2 + q3, 3);
    *oq1 = ROUND_POWER_OF_TWO(p1 + p0 + q0 + 2 * q1 + q2 + q3 + q3, 3);
    *oq2 = ROUND_POWER_OF_TWO(p0 + q0 + q1 + 2 * q2 + q3 + q3 + q3, 3);
  } else {
    filter4(mask, thresh, op1, op0, oq0, oq1);
  }
}